

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

DynamicTypeHandler * __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>::
ConvertToTypeWithItemAttributes
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *this,
          DynamicObject *instance)

{
  bool bVar1;
  undefined8 local_28;
  DynamicObject *instance_local;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *this_local;
  
  bVar1 = Js::JavascriptArray::IsNonES5Array(instance);
  if (bVar1) {
    local_28 = ConvertToES5ArrayType(this,instance);
  }
  else {
    local_28 = (ES5ArrayTypeHandlerBase<unsigned_short> *)ConvertToDictionaryType(this,instance);
  }
  return (DynamicTypeHandler *)local_28;
}

Assistant:

DynamicTypeHandler* SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::ConvertToTypeWithItemAttributes(DynamicObject* instance)
    {
        return JavascriptArray::IsNonES5Array(instance) ?
            ConvertToES5ArrayType(instance) : ConvertToDictionaryType(instance);
    }